

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_unittest.cc
# Opt level: O2

void Test_Demangle_CornerCases::RunTest(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char tmp [10];
  
  tmp[8] = '\0';
  tmp[9] = '\0';
  tmp[0] = '\0';
  tmp[1] = '\0';
  tmp[2] = '\0';
  tmp[3] = '\0';
  tmp[4] = '\0';
  tmp[5] = '\0';
  tmp[6] = '\0';
  tmp[7] = '\0';
  bVar1 = google::Demangle("_Z6foobarv",tmp,10);
  if (bVar1) {
    iVar2 = bcmp("foobar()",tmp,9);
    if (iVar2 != 0) {
LAB_00109973:
      fprintf(_stderr,"Check failed: streq(%s, %s)\n","demangled","tmp");
      goto LAB_00109a42;
    }
    bVar1 = google::Demangle("_Z6foobarv",tmp,9);
    if (bVar1) {
      iVar2 = bcmp("foobar()",tmp,9);
      if (iVar2 != 0) goto LAB_00109973;
      bVar1 = google::Demangle("_Z6foobarv",tmp,8);
      if (bVar1) {
        pcVar3 = "!(Demangle(mangled, tmp, size - 2))";
      }
      else {
        bVar1 = google::Demangle("_Z6foobarv",tmp,1);
        if (bVar1) {
          pcVar3 = "!(Demangle(mangled, tmp, 1))";
        }
        else {
          bVar1 = google::Demangle("_Z6foobarv",tmp,0);
          if (bVar1) {
            pcVar3 = "!(Demangle(mangled, tmp, 0))";
          }
          else {
            bVar1 = google::Demangle("_Z6foobarv",(char *)0x0,0);
            if (!bVar1) {
              return;
            }
            pcVar3 = "!(Demangle(mangled, nullptr, 0))";
          }
        }
      }
    }
    else {
      pcVar3 = "Demangle(mangled, tmp, size - 1)";
    }
  }
  else {
    pcVar3 = "Demangle(mangled, tmp, sizeof(tmp))";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar3);
LAB_00109a42:
  exit(1);
}

Assistant:

TEST(Demangle, CornerCases) {
  const size_t size = 10;
  char tmp[size] = {0};
  const char* demangled = "foobar()";
  const char* mangled = "_Z6foobarv";
  EXPECT_TRUE(Demangle(mangled, tmp, sizeof(tmp)));
  // sizeof("foobar()") == size - 1
  EXPECT_STREQ(demangled, tmp);
  EXPECT_TRUE(Demangle(mangled, tmp, size - 1));
  EXPECT_STREQ(demangled, tmp);
  EXPECT_FALSE(Demangle(mangled, tmp, size - 2));  // Not enough.
  EXPECT_FALSE(Demangle(mangled, tmp, 1));
  EXPECT_FALSE(Demangle(mangled, tmp, 0));
  EXPECT_FALSE(Demangle(mangled, nullptr, 0));  // Should not cause SEGV.
}